

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thpool.c
# Opt level: O0

int thpool_add_work(thpool_ *thpool_p,_func_void_void_ptr *function_p,void *arg_p)

{
  job *newjob_00;
  job *newjob;
  void *arg_p_local;
  _func_void_void_ptr *function_p_local;
  thpool_ *thpool_p_local;
  
  newjob_00 = (job *)malloc(0x18);
  if (newjob_00 == (job *)0x0) {
    fprintf(_stderr,"thpool_add_work(): Could not allocate memory for new job\n");
    thpool_p_local._4_4_ = -1;
  }
  else {
    newjob_00->function = function_p;
    newjob_00->arg = arg_p;
    jobqueue_push(&thpool_p->jobqueue,newjob_00);
    thpool_p_local._4_4_ = 0;
  }
  return thpool_p_local._4_4_;
}

Assistant:

int thpool_add_work(thpool_* thpool_p, void (*function_p)(void*), void* arg_p){
	job* newjob;

	newjob=(struct job*)malloc(sizeof(struct job));
	if (newjob==NULL){
		err("thpool_add_work(): Could not allocate memory for new job\n");
		return -1;
	}

	/* add function and argument */
	newjob->function=function_p;
	newjob->arg=arg_p;

	/* add job to queue */
	jobqueue_push(&thpool_p->jobqueue, newjob);

	return 0;
}